

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O3

REF_STATUS ref_geom_report_tri_area_normdev(REF_GRID ref_grid)

{
  REF_CELL ref_cell;
  REF_MPI ref_mpi;
  REF_STATUS RVar1;
  uint uVar2;
  undefined8 uVar3;
  int cell;
  char *pcVar4;
  REF_DBL local;
  REF_DBL max_uv_area;
  REF_DBL min_uv_area;
  REF_DBL max_area;
  REF_DBL min_area;
  REF_DBL min_normdev;
  REF_DBL uv_area;
  REF_DBL area_sign;
  REF_DBL area;
  REF_DBL normdev;
  REF_INT nodes [27];
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  REF_MPI local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  REF_INT local_a8 [30];
  
  local_c8 = ref_grid->mpi;
  ref_cell = ref_grid->cell[3];
  local_d8 = 2.0;
  local_e0 = 1e+200;
  local_e8 = -1e+200;
  local_f0 = 1e+200;
  local_f8 = -1e+200;
  if (ref_cell->max < 1) {
    local_108 = 2.0;
    local_128 = -1e+200;
    local_118 = -1e+200;
    local_120 = 1e+200;
    local_110 = 1e+200;
  }
  else {
    cell = 0;
    local_108 = 2.0;
    local_128 = -1e+200;
    local_118 = -1e+200;
    local_120 = 1e+200;
    local_110 = 1e+200;
    do {
      RVar1 = ref_cell_nodes(ref_cell,cell,local_a8);
      if (RVar1 == 0) {
        uVar2 = ref_geom_tri_norm_deviation(ref_grid,local_a8,&local_b0);
        if (uVar2 != 0) {
          pcVar4 = "norm dev";
          uVar3 = 0xef6;
          goto LAB_0014ca81;
        }
        if (local_b0 <= local_108) {
          local_108 = local_b0;
        }
        local_d8 = local_108;
        uVar2 = ref_node_tri_area(ref_grid->node,local_a8,&local_b8);
        if (uVar2 != 0) {
          pcVar4 = "vol";
          uVar3 = 0xef8;
          goto LAB_0014ca81;
        }
        if (local_b8 <= local_110) {
          local_110 = local_b8;
        }
        if (local_118 <= local_b8) {
          local_118 = local_b8;
        }
        local_e8 = local_118;
        local_e0 = local_110;
        uVar2 = ref_geom_uv_area_sign(ref_grid,local_a8[ref_cell->node_per],&local_c0);
        if (uVar2 != 0) {
          pcVar4 = "a sign";
          uVar3 = 0xefc;
          goto LAB_0014ca81;
        }
        uVar2 = ref_geom_uv_area(ref_grid->geom,local_a8,&local_d0);
        if (uVar2 != 0) {
          pcVar4 = "uv area";
          uVar3 = 0xefd;
          goto LAB_0014ca81;
        }
        local_d0 = local_c0 * local_d0;
        if (local_d0 <= local_120) {
          local_120 = local_d0;
        }
        local_f8 = local_128;
        local_f0 = local_120;
        if (local_128 <= local_d0) {
          local_128 = local_d0;
          local_f8 = local_d0;
        }
      }
      cell = cell + 1;
    } while (cell < ref_cell->max);
  }
  ref_mpi = local_c8;
  local_100 = local_108;
  uVar2 = ref_mpi_min(local_c8,&local_100,&local_d8,3);
  if (uVar2 == 0) {
    local_100 = local_110;
    uVar2 = ref_mpi_min(ref_mpi,&local_100,&local_e0,3);
    if (uVar2 == 0) {
      local_100 = local_120;
      uVar2 = ref_mpi_min(ref_mpi,&local_100,&local_f0,3);
      if (uVar2 == 0) {
        local_100 = local_118;
        uVar2 = ref_mpi_max(ref_mpi,&local_100,&local_e8,3);
        if (uVar2 == 0) {
          local_100 = local_128;
          uVar2 = ref_mpi_max(ref_mpi,&local_100,&local_f8,3);
          if (uVar2 == 0) {
            if (ref_mpi->id != 0) {
              return 0;
            }
            printf("normdev %f area %.5e  %.5e uv area  %.5e  %.5e\n",local_d8,local_e0,local_e8,
                   local_f0,local_f8);
            return 0;
          }
          pcVar4 = "mpi max";
          uVar3 = 0xf0b;
        }
        else {
          pcVar4 = "mpi max";
          uVar3 = 0xf09;
        }
      }
      else {
        pcVar4 = "mpi min";
        uVar3 = 0xf07;
      }
    }
    else {
      pcVar4 = "mpi min";
      uVar3 = 0xf05;
    }
  }
  else {
    pcVar4 = "mpi min";
    uVar3 = 0xf03;
  }
LAB_0014ca81:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",uVar3,
         "ref_geom_report_tri_area_normdev",(ulong)uVar2,pcVar4);
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_report_tri_area_normdev(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], id;
  REF_DBL min_normdev, min_area, max_area, min_uv_area, max_uv_area;
  REF_DBL normdev, area, uv_area, area_sign;
  REF_DBL local;

  min_normdev = 2.0;
  min_area = REF_DBL_MAX;
  max_area = REF_DBL_MIN;
  min_uv_area = REF_DBL_MAX;
  max_uv_area = REF_DBL_MIN;
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
    min_normdev = MIN(min_normdev, normdev);
    RSS(ref_node_tri_area(ref_grid_node(ref_grid), nodes, &area), "vol");
    min_area = MIN(min_area, area);
    max_area = MAX(max_area, area);
    id = nodes[ref_cell_node_per(ref_cell)];
    RSS(ref_geom_uv_area_sign(ref_grid, id, &area_sign), "a sign");
    RSS(ref_geom_uv_area(ref_grid_geom(ref_grid), nodes, &uv_area), "uv area");
    uv_area *= area_sign;
    min_uv_area = MIN(min_uv_area, uv_area);
    max_uv_area = MAX(max_uv_area, uv_area);
  }
  local = min_normdev;
  RSS(ref_mpi_min(ref_mpi, &local, &min_normdev, REF_DBL_TYPE), "mpi min");
  local = min_area;
  RSS(ref_mpi_min(ref_mpi, &local, &min_area, REF_DBL_TYPE), "mpi min");
  local = min_uv_area;
  RSS(ref_mpi_min(ref_mpi, &local, &min_uv_area, REF_DBL_TYPE), "mpi min");
  local = max_area;
  RSS(ref_mpi_max(ref_mpi, &local, &max_area, REF_DBL_TYPE), "mpi max");
  local = max_uv_area;
  RSS(ref_mpi_max(ref_mpi, &local, &max_uv_area, REF_DBL_TYPE), "mpi max");

  if (ref_mpi_once(ref_mpi)) {
    printf("normdev %f area %.5e  %.5e uv area  %.5e  %.5e\n", min_normdev,
           min_area, max_area, min_uv_area, max_uv_area);
  }

  return REF_SUCCESS;
}